

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void bloaty::BloatyDoMain(Options *options,InputFileFactory *file_factory,RollupOutput *output)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  int64 iVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  const_iterator this;
  string *psVar7;
  Options *in_RDI;
  RollupOutput *in_stack_00000050;
  Options *in_stack_00000058;
  Bloaty *in_stack_00000060;
  ReImpl re;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data_source;
  const_iterator __end1_5;
  const_iterator __begin1_5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_5;
  CustomDataSource *custom_data_source;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  RepeatedPtrField<bloaty::CustomDataSource> *__range1_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sourcemap;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *debug_filename;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *base_filename;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  Bloaty bloaty;
  string *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  char *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  InputFileFactory *in_stack_fffffffffffffb88;
  Bloaty *in_stack_fffffffffffffb90;
  reference in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  Bloaty *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc10;
  reference in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  RollupOutput *in_stack_fffffffffffffcd0;
  Options *in_stack_fffffffffffffcd8;
  Bloaty *in_stack_fffffffffffffce0;
  string_view in_stack_fffffffffffffce8;
  CustomDataSource *in_stack_fffffffffffffd08;
  Bloaty *in_stack_fffffffffffffd10;
  iterator local_2c0;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2b0;
  reference local_2a8;
  iterator local_2a0;
  RepeatedPtrIterator<const_bloaty::CustomDataSource> local_298;
  RepeatedPtrField<bloaty::CustomDataSource> *local_290;
  reference local_288;
  iterator local_280;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_270;
  reference local_268;
  iterator local_260;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  string *local_250;
  Bloaty *local_248;
  iterator local_240;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_230;
  reference local_228;
  iterator local_220;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_210;
  Options *local_8;
  
  local_8 = in_RDI;
  Bloaty::Bloaty(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                 (Options *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  iVar4 = Options::filename_size((Options *)0x1a0e99);
  if (iVar4 == 0) {
    Throw(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
  }
  iVar5 = Options::max_rows_per_level((Options *)0x1a0ee7);
  if (0 < iVar5) {
    local_210 = Options::filename_abi_cxx11_(local_8);
    local_218.it_ =
         (void **)google::protobuf::
                  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::begin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffffb28);
    local_220.it_ =
         (void **)google::protobuf::
                  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::end((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    while (uVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator!=(&local_218,&local_220), (bool)uVar1) {
      in_stack_fffffffffffffc18 =
           google::protobuf::internal::
           RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_218);
      local_228 = in_stack_fffffffffffffc18;
      Bloaty::AddFilename((Bloaty *)CONCAT17(uVar1,in_stack_fffffffffffffc20),
                          in_stack_fffffffffffffc18,
                          SUB81((ulong)in_stack_fffffffffffffc10 >> 0x38,0));
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_218);
    }
    pRVar6 = Options::base_filename_abi_cxx11_(local_8);
    local_230 = pRVar6;
    local_238.it_ =
         (void **)google::protobuf::
                  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::begin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffffb28);
    this = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    local_240.it_ = this.it_;
    while (uVar2 = google::protobuf::internal::
                   RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator!=(&local_238,&local_240), (bool)uVar2) {
      in_stack_fffffffffffffbf0 =
           (Bloaty *)
           google::protobuf::internal::
           RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_238);
      local_248 = in_stack_fffffffffffffbf0;
      Bloaty::AddFilename((Bloaty *)CONCAT17(uVar1,in_stack_fffffffffffffc20),
                          in_stack_fffffffffffffc18,SUB81((ulong)pRVar6 >> 0x38,0));
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_238);
    }
    psVar7 = (string *)Options::debug_filename_abi_cxx11_(local_8);
    local_250 = psVar7;
    local_258.it_ =
         (void **)google::protobuf::
                  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::begin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffffb28);
    local_260.it_ =
         (void **)google::protobuf::
                  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::end((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    while (uVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator!=(&local_258,&local_260), (bool)uVar1) {
      in_stack_fffffffffffffbc8 =
           google::protobuf::internal::
           RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_258);
      local_268 = in_stack_fffffffffffffbc8;
      Bloaty::AddDebugFilename(in_stack_fffffffffffffbf0,psVar7);
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_258);
    }
    local_270 = Options::source_map_abi_cxx11_(local_8);
    local_278.it_ =
         (void **)google::protobuf::
                  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::begin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffffb28);
    local_280.it_ =
         (void **)google::protobuf::
                  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::end((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    while (bVar3 = google::protobuf::internal::
                   RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator!=(&local_278,&local_280), bVar3) {
      local_288 = google::protobuf::internal::
                  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_278);
      Bloaty::AddSourceMapFilename
                ((Bloaty *)this.it_,(string *)CONCAT17(uVar2,in_stack_fffffffffffffbf8));
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_278);
    }
    local_290 = Options::custom_data_source(local_8);
    local_298.it_ =
         (void **)google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::begin
                            ((RepeatedPtrField<bloaty::CustomDataSource> *)in_stack_fffffffffffffb28
                            );
    local_2a0.it_ =
         (void **)google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::end
                            ((RepeatedPtrField<bloaty::CustomDataSource> *)
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    while (bVar3 = google::protobuf::internal::RepeatedPtrIterator<const_bloaty::CustomDataSource>::
                   operator!=(&local_298,&local_2a0), bVar3) {
      local_2a8 = google::protobuf::internal::RepeatedPtrIterator<const_bloaty::CustomDataSource>::
                  operator*(&local_298);
      Bloaty::DefineCustomDataSource(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      google::protobuf::internal::RepeatedPtrIterator<const_bloaty::CustomDataSource>::operator++
                (&local_298);
    }
    local_2b0 = Options::data_source_abi_cxx11_(local_8);
    local_2b8.it_ =
         (void **)google::protobuf::
                  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::begin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffffb28);
    local_2c0.it_ =
         (void **)google::protobuf::
                  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::end((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    while (bVar3 = google::protobuf::internal::
                   RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator!=(&local_2b8,&local_2c0), bVar3) {
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_2b8);
      Bloaty::AddDataSource
                ((Bloaty *)CONCAT17(uVar1,in_stack_fffffffffffffbd0),in_stack_fffffffffffffbc8);
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_2b8);
    }
    bVar3 = Options::has_source_filter((Options *)0x1a148d);
    if (bVar3) {
      psVar7 = Options::source_filter_abi_cxx11_((Options *)0x1a14ad);
      ReImpl::ReImpl((ReImpl *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                     in_stack_fffffffffffffb28);
      bVar3 = ReImpl::ok((ReImpl *)0x1a14d5);
      if (!bVar3) {
        Throw((char *)psVar7,CONCAT13(bVar3,(int3)in_stack_fffffffffffffb3c));
      }
      ReImpl::~ReImpl((ReImpl *)0x1a152b);
    }
    verbose_level = Options::verbose_level((Options *)0x1a1538);
    iVar4 = Options::data_source_size((Options *)0x1a1555);
    if (iVar4 < 1) {
      bVar3 = Options::has_disassemble_function((Options *)0x1a1592);
      in_stack_fffffffffffffb30 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffb30);
      if (bVar3) {
        psVar7 = Options::disassemble_function_abi_cxx11_((Options *)0x1a15af);
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
        Bloaty::DisassembleFunction
                  (in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,in_stack_fffffffffffffcd8,
                   in_stack_fffffffffffffcd0);
      }
    }
    else {
      Bloaty::ScanAndRollup(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    }
    Bloaty::~Bloaty((Bloaty *)CONCAT44(iVar4,in_stack_fffffffffffffb30));
    return;
  }
  Throw(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
}

Assistant:

void BloatyDoMain(const Options& options, const InputFileFactory& file_factory,
                  RollupOutput* output) {
  bloaty::Bloaty bloaty(file_factory, options);

  if (options.filename_size() == 0) {
    THROW("must specify at least one file");
  }

  if (options.max_rows_per_level() < 1) {
    THROW("max_rows_per_level must be at least 1");
  }

  for (auto& filename : options.filename()) {
    bloaty.AddFilename(filename, false);
  }

  for (auto& base_filename : options.base_filename()) {
    bloaty.AddFilename(base_filename, true);
  }

  for (auto& debug_filename : options.debug_filename()) {
    bloaty.AddDebugFilename(debug_filename);
  }

  for (auto& sourcemap : options.source_map()) {
    bloaty.AddSourceMapFilename(sourcemap);
  }

  for (const auto& custom_data_source : options.custom_data_source()) {
    bloaty.DefineCustomDataSource(custom_data_source);
  }

  for (const auto& data_source : options.data_source()) {
    bloaty.AddDataSource(data_source);
  }

  if (options.has_source_filter()) {
    ReImpl re(options.source_filter());
    if (!re.ok()) {
      THROW("invalid regex for source_filter");
    }
  }

  verbose_level = options.verbose_level();

  if (options.data_source_size() > 0) {
    bloaty.ScanAndRollup(options, output);
  } else if (options.has_disassemble_function()) {
    bloaty.DisassembleFunction(options.disassemble_function(), options, output);
  }
}